

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O2

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
_applyScaledSides<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *solver,Rational *primalScale)

{
  uint uVar1;
  type_conflict5 tVar2;
  _func_int **pp_Var3;
  ulong uVar4;
  uint uVar5;
  cpp_dec_float<50U,_int,_void> local_68;
  
  uVar5 = *(uint *)(*(long *)(this + 0x52e0) + 0x38);
  while (0 < (int)uVar5) {
    uVar5 = uVar5 - 1;
    uVar4 = (ulong)uVar5;
    uVar1 = *(uint *)(*(long *)(this + 0x5a78) + uVar4 * 4);
    if (uVar1 < 5) {
      if ((0x1aU >> (uVar1 & 0x1f) & 1) != 0) {
        local_68.data._M_elems[0] = 1;
        tVar2 = boost::multiprecision::operator!=(primalScale,(int *)&local_68);
        if (tVar2) {
          boost::
          rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator*=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)(uVar4 * 0x40 + *(long *)(this + 0x5998)),
                       (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)primalScale);
        }
        tVar2 = boost::multiprecision::operator<=
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)(*(long *)(this + 0x5998) + uVar4 * 0x40),
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)(this + 0x80));
        if (tVar2) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&local_68,-*(double *)(*(long *)(this + 0x28) + 0xc0),(type *)0x0);
          pp_Var3 = (solver->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._vptr_ClassArray;
        }
        else {
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
          ::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_68,
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)(uVar4 * 0x40 + *(long *)(this + 0x5998)),(type *)0x0);
          pp_Var3 = (solver->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._vptr_ClassArray;
        }
        (*pp_Var3[0x33])(solver,(ulong)uVar5,&local_68,0);
      }
    }
    if (*(int *)(*(long *)(this + 0x5a78) + uVar4 * 4) - 2U < 3) {
      local_68.data._M_elems[0] = 1;
      tVar2 = boost::multiprecision::operator!=(primalScale,(int *)&local_68);
      if (tVar2) {
        boost::
        rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator*=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)(uVar4 * 0x40 + *(long *)(this + 0x59b0)),
                     (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)primalScale);
      }
      tVar2 = boost::multiprecision::operator>=
                        ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)(*(long *)(this + 0x59b0) + uVar4 * 0x40),
                         (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)(this + 0x40));
      if (tVar2) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&local_68,*(double *)(*(long *)(this + 0x28) + 0xc0),(type *)0x0);
        pp_Var3 = (solver->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._vptr_ClassArray;
      }
      else {
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
        ::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_68,
                   (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                    *)(uVar4 * 0x40 + *(long *)(this + 0x59b0)),(type *)0x0);
        pp_Var3 = (solver->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._vptr_ClassArray;
      }
      (*pp_Var3[0x36])(solver,(ulong)uVar5,&local_68,0);
    }
  }
  return;
}

Assistant:

void SoPlexBase<R>::_applyScaledSides(SPxSolverBase<T>& solver, Rational& primalScale)
{
   assert(primalScale >= 1);

   for(int r = numRowsRational() - 1; r >= 0; r--)
   {
      if(_lowerFinite(_rowTypes[r]))
      {
         if(primalScale != 1)
            _modLhs[r] *= primalScale;

         if(_modLhs[r] <= _rationalNegInfty)
            solver.changeLhs(r, -realParam(SoPlexBase<R>::INFTY));
         else
            solver.changeLhs(r, T(_modLhs[r]));
      }

      if(_upperFinite(_rowTypes[r]))
      {
         if(primalScale != 1)
            _modRhs[r] *= primalScale;

         if(_modRhs[r] >= _rationalPosInfty)
            solver.changeRhs(r, realParam(SoPlexBase<R>::INFTY));
         else
            solver.changeRhs(r, T(_modRhs[r]));
      }
   }
}